

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O1

void __thiscall BigInteger::_divide(BigInteger *this,int a,int *remainder)

{
  pointer puVar1;
  ulong uVar2;
  pointer puVar3;
  zero_division_error *this_00;
  ulong uVar4;
  ulong uVar5;
  pointer puVar6;
  
  uVar5 = (ulong)(uint)a;
  if (a == 0) {
    this_00 = (zero_division_error *)__cxa_allocate_exception(0x10);
    zero_division_error::runtime_error(this_00,"Integer division by zero");
    __cxa_throw(this_00,&zero_division_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar3) {
    *remainder = 0;
  }
  else {
    if (a < 0) {
      this->negative = (bool)(this->negative ^ 1);
      uVar5 = (ulong)(uint)-a;
    }
    if (puVar3 == puVar1) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      puVar6 = puVar3;
      do {
        uVar2 = (ulong)puVar6[-1] + uVar4 * 1000000000;
        uVar4 = uVar2 % uVar5;
        puVar6[-1] = (uint)(uVar2 / uVar5);
        puVar6 = puVar6 + -1;
      } while (puVar6 != puVar1);
    }
    *remainder = (int)uVar4;
    do {
      puVar6 = puVar3 + -1;
      if (*puVar6 != 0) break;
      (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      puVar3 = puVar6;
    } while (puVar6 != puVar1);
    if (puVar1 == puVar3) {
      this->negative = false;
    }
  }
  return;
}

Assistant:

void BigInteger::_divide(int a, int &remainder)
{
    if(!a)
        throw zero_division_error("Integer division by zero");
    if(digits.empty())
    {
        remainder = 0;
        return;
    }
    if(a < 0)
    {
        negative ^= 1;
        a = -a;
    }
    long long carry = 0;
    for(auto i = digits.rbegin(); i != digits.rend(); ++i)
    {
        carry = carry * BLOCK_MOD + *i;
        *i = carry / a;
        carry %= a;
    }
    remainder = static_cast<int>(carry);
    normalize();
}